

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json2map.c
# Opt level: O0

int json2map_parseArray(json2map_t *obj,char *path,char *jsonString,jsmntok_t *token,int start,
                       int end)

{
  undefined8 uVar1;
  uint uVar2;
  json2map_t *obj_00;
  char *__ptr;
  csafestring_t *pcVar3;
  jsmntok_t *in_RCX;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  char smallBuffer [25];
  csafestring_t *tmp;
  int i;
  int count;
  csafestring_t *objPathBuff;
  csafestring_t *pathBuff;
  char *buffer;
  int newEnd;
  undefined7 in_stack_ffffffffffffff68;
  char in_stack_ffffffffffffff6f;
  jsmntype_t in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  csafestring_t *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  jsmntok_t *in_stack_ffffffffffffffa0;
  int iVar4;
  csafestring_t *in_stack_ffffffffffffffb0;
  
  iVar4 = 0;
  while( true ) {
    uVar2 = in_stack_ffffffffffffff74 & 0xffffff;
    if (in_R8D < in_R9D) {
      uVar2 = CONCAT13(0 < in_R8D,(int3)in_stack_ffffffffffffff74);
    }
    in_stack_ffffffffffffff74 = uVar2;
    if ((char)(in_stack_ffffffffffffff74 >> 0x18) == '\0') break;
    obj_00 = (json2map_t *)
             json2map_concatPaths
                       ((char *)in_stack_ffffffffffffff80,
                        (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        in_stack_ffffffffffffff74);
    iVar4 = iVar4 + 1;
    in_stack_ffffffffffffff70 = in_RCX[in_R8D].type;
    if (in_stack_ffffffffffffff70 == JSMN_OBJECT) {
      json2map_calcEnd(in_RCX,in_R8D,in_R9D);
      if ((char)in_RDI[2] != '\0') {
        in_stack_ffffffffffffffb0 =
             safe_clone((csafestring_t *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        safe_strchrappend((csafestring_t *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6f);
        safe_strchrappend((csafestring_t *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6f);
        safe_strchrappend((csafestring_t *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6f);
        in_stack_ffffffffffffffa0 =
             (jsmntok_t *)
             safe_create((char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        safe_memset(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        safe_memcpy(in_stack_ffffffffffffff80,
                    (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        uVar1._0_4_ = in_stack_ffffffffffffffa0->type;
        uVar1._4_4_ = in_stack_ffffffffffffffa0->start;
        (*(code *)*in_RDI)(in_RDI[1],in_stack_ffffffffffffffb0->data,uVar1);
        safe_destroy((csafestring_t *)0x107e8a);
        safe_destroy((csafestring_t *)0x107e94);
      }
      in_R8D = json2map_parseObject
                         (obj_00,(char *)in_stack_ffffffffffffffb0,(char *)CONCAT44(iVar4,in_R8D),
                          in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                          in_stack_ffffffffffffff98);
    }
    else {
      if (1 < in_stack_ffffffffffffff70 - JSMN_STRING) {
        return -1;
      }
      __ptr = json2map_setTokenValue
                        ((char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (jsmntok_t *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68))
      ;
      if (*in_RDI != 0) {
        (*(code *)*in_RDI)(in_RDI[1],obj_00->dataMapHook,__ptr);
      }
      free(__ptr);
      in_R8D = in_R8D + 1;
    }
    safe_destroy((csafestring_t *)0x107f50);
  }
  pcVar3 = json2map_concatPaths
                     ((char *)in_stack_ffffffffffffff80,
                      (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                      in_stack_ffffffffffffff74);
  stringlib_longToString
            ((char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  if (*in_RDI != 0) {
    (*(code *)*in_RDI)(in_RDI[1],pcVar3->data,&stack0xffffffffffffff78);
  }
  safe_destroy((csafestring_t *)0x107fbd);
  if (-1 < in_R8D) {
    return in_R9D;
  }
  return in_R8D;
}

Assistant:

static int json2map_parseArray(json2map_t *obj, char *path, char *jsonString, jsmntok_t *token, int start, int end) {
	DEBUG_TEXT("json2map_parseArray([json2map_t *], %s, %s, [jsmntok_t *], %d, %d)...", path, jsonString, start, end);
	int newEnd;
	char *buffer;
	csafestring_t *pathBuff;
	csafestring_t *objPathBuff;
	int count = 0;

	int i = start;
	while ( i < end && i > 0 ) {

		pathBuff = json2map_concatPaths(NULL, path, count);
		count++;

		switch ( token[i].type ) {
			case JSMN_OBJECT:
				newEnd = json2map_calcEnd(token, i, end);

				if ( obj->saveSubobjectString ) {

					objPathBuff = safe_clone(pathBuff);
					safe_strchrappend(objPathBuff, JSON2MAP_MAP_ARRAY_START);
					safe_strchrappend(objPathBuff, JSON2MAP_MAP_OBJECT_CODE);
					safe_strchrappend(objPathBuff, JSON2MAP_MAP_ARRAY_END);

					csafestring_t *tmp = safe_create(NULL);
					safe_memset(tmp, '\0', token[i].end - token[i].start + 1);
					safe_memcpy(tmp, &jsonString[token[i].start], token[i].end - token[i].start);

					obj->dataMapHook(obj->dataMapData, objPathBuff->data, tmp->data);
					safe_destroy(tmp);
					safe_destroy(objPathBuff);
				}

				i = json2map_parseObject(obj, pathBuff->data, jsonString, token, i + 1, newEnd + 1);

				break;
			case JSMN_STRING:
			case JSMN_PRIMITIVE:
				buffer = json2map_setTokenValue(jsonString, &token[i]);
				if ( obj->dataMapHook != NULL ) {
					obj->dataMapHook(obj->dataMapData, pathBuff->data, buffer);
				}
				free(buffer);
				i++;
				break;
			default:
				DEBUG_TEXT("json2map_parseArray([json2map_t *], %s, %s, [jsmntok_t *], %d, %d): ERROR: Not defined type", path, jsonString, start, end);
				return -1;
		}

		safe_destroy(pathBuff);
	}

	pathBuff = json2map_concatPaths(NULL, path, -2);

	char smallBuffer[25];
	stringlib_longToString(smallBuffer, count);
	if ( obj->dataMapHook != NULL ) {
		obj->dataMapHook(obj->dataMapData, pathBuff->data, smallBuffer);
	}
	safe_destroy(pathBuff);

	DEBUG_TEXT("json2map_parseArray([json2map_t *], %s, %s, [jsmntok_t *], %d, %d)... DONE", path, jsonString, start, end);
	if ( i < 0 ) {
		return i;
	}
	return end;
}